

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_file_mode(char *file,wchar_t line,char *pathname,wchar_t expected_mode)

{
  undefined1 local_c8 [8];
  stat st;
  wchar_t r;
  wchar_t mode;
  wchar_t expected_mode_local;
  char *pathname_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  st.__glibc_reserved[2]._4_4_ = lstat(pathname,(stat *)local_c8);
  if ((st.__glibc_reserved[2]._4_4_ == 0) && (((uint)st.st_nlink & 0x1ff) == expected_mode)) {
    file_local._4_4_ = L'\x01';
  }
  else {
    failure_start(file,line,"File %s has mode %o, expected %o",pathname,
                  (ulong)((uint)st.st_nlink & 0x1ff),(ulong)(uint)expected_mode);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_file_mode(const char *file, int line, const char *pathname, int expected_mode)
{
	int mode;
	int r;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	failure_start(file, line, "assertFileMode not yet implemented for Windows");
	(void)mode; /* UNUSED */
	(void)r; /* UNUSED */
	(void)pathname; /* UNUSED */
	(void)expected_mode; /* UNUSED */
#else
	{
		struct stat st;
		r = lstat(pathname, &st);
		mode = (int)(st.st_mode & 0777);
	}
	if (r == 0 && mode == expected_mode)
			return (1);
	failure_start(file, line, "File %s has mode %o, expected %o",
	    pathname, (unsigned int)mode, (unsigned int)expected_mode);
#endif
	failure_finish(NULL);
	return (0);
}